

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O0

JL_STATUS JlMemoryVerifyCountFieldLargeEnoughForValue(size_t CountFieldSize,size_t Value)

{
  undefined4 local_1c;
  JL_STATUS jlStatus;
  size_t Value_local;
  size_t CountFieldSize_local;
  
  local_1c = JL_STATUS_COUNT_FIELD_TOO_SMALL;
  if (CountFieldSize == 1) {
    if (Value < 0x100) {
      local_1c = JL_STATUS_SUCCESS;
    }
  }
  else if (CountFieldSize == 2) {
    if (Value < 0x10000) {
      local_1c = JL_STATUS_SUCCESS;
    }
  }
  else if (CountFieldSize == 4) {
    if (Value < 0x100000000) {
      local_1c = JL_STATUS_SUCCESS;
    }
  }
  else if (CountFieldSize == 8) {
    local_1c = JL_STATUS_SUCCESS;
  }
  else {
    local_1c = JL_STATUS_INTERNAL_ERROR;
  }
  return local_1c;
}

Assistant:

JL_STATUS
    JlMemoryVerifyCountFieldLargeEnoughForValue
    (
        size_t          CountFieldSize,
        size_t          Value
    )
{
    JL_STATUS jlStatus;

    jlStatus = JL_STATUS_COUNT_FIELD_TOO_SMALL;
    if( sizeof(uint8_t) == CountFieldSize )
    {
        if( Value <= 0xff )
        {
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else if( sizeof(uint16_t) == CountFieldSize )
    {
        if( Value <= 0xffff )
        {
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else if( sizeof(uint32_t) == CountFieldSize )
    {
        if( Value <= 0xffffffff )
        {
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else if( sizeof(uint64_t) == CountFieldSize )
    {
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        jlStatus = JL_STATUS_INTERNAL_ERROR;
    }

    return jlStatus;
}